

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

void __thiscall
icu_63::CollationRuleParser::parseRuleChain(CollationRuleParser *this,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  char16_t *pcVar7;
  int i;
  uint uVar8;
  char cVar9;
  
  uVar4 = parseResetAndPosition(this,errorCode);
  bVar3 = true;
  do {
    uVar5 = parseRelationOperator(this,errorCode);
    cVar9 = '\x01';
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((int)uVar5 < 0) {
        pUVar2 = this->rules;
        sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar5 = (pUVar2->fUnion).fFields.fLength;
        }
        else {
          uVar5 = (int)sVar1 >> 5;
        }
        uVar8 = this->ruleIndex;
        if (uVar8 < uVar5 && (int)uVar8 < (int)uVar5) {
          if (((int)sVar1 & 2U) == 0) {
            pcVar7 = (pUVar2->fUnion).fFields.fArray;
          }
          else {
            pcVar7 = (char16_t *)((long)&pUVar2->fUnion + 2);
          }
          if (pcVar7[(int)uVar8] == L'#') {
            iVar6 = skipComment(this,uVar8 + 1);
            this->ruleIndex = iVar6;
            cVar9 = '\x03';
            goto LAB_0023ce40;
          }
        }
        if (bVar3) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          this->errorReason = "reset not followed by a relation";
LAB_0023ce31:
          if (this->parseError != (UParseError *)0x0) {
            setErrorContext(this);
          }
        }
      }
      else {
        uVar8 = uVar5 & 0xf;
        if ((int)uVar4 < 0xf) {
          if (bVar3) {
            if (uVar8 != uVar4) {
              *errorCode = U_INVALID_FORMAT_ERROR;
              this->errorReason = "reset-before strength differs from its first relation";
              bVar3 = true;
              goto LAB_0023ce31;
            }
          }
          else if ((int)uVar8 < (int)uVar4) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            this->errorReason = "reset-before strength followed by a stronger relation";
            if (this->parseError != (UParseError *)0x0) {
              setErrorContext(this);
            }
            bVar3 = false;
            goto LAB_0023ce40;
          }
        }
        i = (uVar5 >> 8) + this->ruleIndex;
        if ((uVar5 & 0x10) == 0) {
          parseRelationStrings(this,uVar8,i,errorCode);
        }
        else {
          parseStarredCharacters(this,uVar8,i,errorCode);
        }
        cVar9 = U_ZERO_ERROR < *errorCode;
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          bVar3 = false;
        }
      }
    }
LAB_0023ce40:
    if ((cVar9 != '\0') && (cVar9 != '\x03')) {
      return;
    }
  } while( true );
}

Assistant:

void
CollationRuleParser::parseRuleChain(UErrorCode &errorCode) {
    int32_t resetStrength = parseResetAndPosition(errorCode);
    UBool isFirstRelation = TRUE;
    for(;;) {
        int32_t result = parseRelationOperator(errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(result < 0) {
            if(ruleIndex < rules->length() && rules->charAt(ruleIndex) == 0x23) {
                // '#' starts a comment, until the end of the line
                ruleIndex = skipComment(ruleIndex + 1);
                continue;
            }
            if(isFirstRelation) {
                setParseError("reset not followed by a relation", errorCode);
            }
            return;
        }
        int32_t strength = result & STRENGTH_MASK;
        if(resetStrength < UCOL_IDENTICAL) {
            // reset-before rule chain
            if(isFirstRelation) {
                if(strength != resetStrength) {
                    setParseError("reset-before strength differs from its first relation", errorCode);
                    return;
                }
            } else {
                if(strength < resetStrength) {
                    setParseError("reset-before strength followed by a stronger relation", errorCode);
                    return;
                }
            }
        }
        int32_t i = ruleIndex + (result >> OFFSET_SHIFT);  // skip over the relation operator
        if((result & STARRED_FLAG) == 0) {
            parseRelationStrings(strength, i, errorCode);
        } else {
            parseStarredCharacters(strength, i, errorCode);
        }
        if(U_FAILURE(errorCode)) { return; }
        isFirstRelation = FALSE;
    }
}